

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

void __thiscall
CVmObjTable::save_image_pointer(CVmObjTable *this,vm_obj_id_t obj_id,char *ptr,size_t siz)

{
  vm_image_ptr_page *pvVar1;
  size_t sVar2;
  
  if (this->image_ptr_head_ == (vm_image_ptr_page *)0x0) {
    pvVar1 = (vm_image_ptr_page *)malloc(0x2588);
    this->image_ptr_head_ = pvVar1;
    if (pvVar1 == (vm_image_ptr_page *)0x0) {
LAB_00298796:
      err_throw(0xca);
    }
    this->image_ptr_tail_ = pvVar1;
    pvVar1->next_ = (vm_image_ptr_page *)0x0;
  }
  else {
    sVar2 = this->image_ptr_last_cnt_;
    if (sVar2 != 400) goto LAB_00298771;
    pvVar1 = (vm_image_ptr_page *)malloc(0x2588);
    this->image_ptr_tail_->next_ = pvVar1;
    pvVar1 = this->image_ptr_tail_->next_;
    if (pvVar1 == (vm_image_ptr_page *)0x0) goto LAB_00298796;
    this->image_ptr_tail_ = pvVar1;
    pvVar1->next_ = (vm_image_ptr_page *)0x0;
  }
  this->image_ptr_last_cnt_ = 0;
  sVar2 = 0;
LAB_00298771:
  pvVar1 = this->image_ptr_tail_;
  pvVar1->ptrs_[sVar2].obj_id_ = obj_id;
  pvVar1->ptrs_[sVar2].image_data_ptr_ = ptr;
  pvVar1->ptrs_[sVar2].image_data_len_ = siz;
  this->image_ptr_last_cnt_ = this->image_ptr_last_cnt_ + 1;
  return;
}

Assistant:

void CVmObjTable::save_image_pointer(vm_obj_id_t obj_id, const char *ptr,
                                     size_t siz)
{
    vm_image_ptr *slot;
    
    /* allocate a new page if we're out of slots on the current page */
    if (image_ptr_head_ == 0)
    {
        /* no pages yet - allocate the first page */
        image_ptr_head_ = (vm_image_ptr_page *)
                          t3malloc(sizeof(vm_image_ptr_page));
        if (image_ptr_head_ == 0)
            err_throw(VMERR_OUT_OF_MEMORY);

        /* it's also the last page */
        image_ptr_tail_ = image_ptr_head_;
        image_ptr_tail_->next_ = 0;

        /* no slots used on this page yet */
        image_ptr_last_cnt_ = 0;
    }
    else if (image_ptr_last_cnt_ == VM_IMAGE_PTRS_PER_PAGE)
    {
        /* the last page is full - allocate another one */
        image_ptr_tail_->next_ = (vm_image_ptr_page *)
                                 t3malloc(sizeof(vm_image_ptr_page));
        if (image_ptr_tail_->next_ == 0)
            err_throw(VMERR_OUT_OF_MEMORY);

        /* it's the new last page */
        image_ptr_tail_ = image_ptr_tail_->next_;
        image_ptr_tail_->next_ = 0;

        /* no slots used on this page yet */
        image_ptr_last_cnt_ = 0;
    }

    /* get the next available slot */
    slot = &image_ptr_tail_->ptrs_[image_ptr_last_cnt_];

    /* save the data */
    slot->obj_id_ = obj_id;
    slot->image_data_ptr_ = ptr;
    slot->image_data_len_ = siz;

    /* count the new record */
    ++image_ptr_last_cnt_;
}